

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

HighsStatus assessLp(HighsLp *lp,HighsOptions *options)

{
  HighsLogOptions *log_options;
  int iVar1;
  bool bVar2;
  HighsStatus HVar3;
  HighsStatus HVar4;
  HighsInt HVar5;
  HighsVarType *integrality;
  HighsStatus call_status;
  allocator local_2c9;
  string local_2c8;
  double local_2a8;
  undefined1 local_2a0 [32];
  undefined1 uStack_280;
  undefined7 uStack_27f;
  undefined1 uStack_278;
  undefined8 uStack_277;
  pointer local_268;
  pointer piStack_260;
  pointer local_258;
  string local_250;
  string local_230;
  HighsLogOptions local_210;
  HighsLogOptions local_1b0;
  HighsLogOptions local_150;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  std::__cxx11::string::string((string *)&local_230,"assessLp",(allocator *)local_2a0);
  log_options = &(options->super_HighsOptionsStruct).log_options;
  bVar2 = lpDimensionsOk(&local_230,lp,log_options);
  std::__cxx11::string::~string((string *)&local_230);
  HighsLogOptions::HighsLogOptions(&local_90,log_options);
  std::__cxx11::string::string((string *)local_2a0,"assessLpDimensions",(allocator *)&local_2c8);
  call_status = (uint)bVar2 + kError;
  HVar3 = interpretCallStatus(&local_90,call_status,kOk,(string *)local_2a0);
  std::__cxx11::string::~string((string *)local_2a0);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  HVar4 = kError;
  if (HVar3 != kError) {
    iVar1 = lp->num_col_;
    if (iVar1 != 0) {
      local_2a0[0x10] = '\0';
      local_2a0._20_4_ = 0xffffffff;
      local_268 = (pointer)0x0;
      piStack_260 = (pointer)0x0;
      local_258 = (pointer)0x0;
      local_2a0._24_8_ = 0;
      uStack_280 = 0;
      uStack_27f = 0;
      uStack_278 = 0;
      uStack_277 = 0;
      local_2a0[4] = true;
      local_2a0._8_4_ = 0;
      local_2a0._12_4_ = iVar1 + -1;
      local_2a0._0_4_ = iVar1;
      assessCosts(options,call_status,(HighsIndexCollection *)local_2a0,&lp->col_cost_,
                  &lp->has_infinite_cost_,(options->super_HighsOptionsStruct).infinite_cost);
      HighsLogOptions::HighsLogOptions(&local_f0,log_options);
      std::__cxx11::string::string((string *)&local_2c8,"assessCosts",&local_2c9);
      HVar4 = interpretCallStatus(&local_f0,kOk,HVar3,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
      HVar3 = kError;
      if (HVar4 == kError) {
        bVar2 = false;
      }
      else {
        local_2a8 = (options->super_HighsOptionsStruct).infinite_bound;
        bVar2 = HighsLp::isMip(lp);
        integrality = (HighsVarType *)0x0;
        if (bVar2) {
          integrality = (lp->integrality_).
                        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                        super__Vector_impl_data._M_start;
        }
        HVar3 = assessBounds(options,"Col",0,(HighsIndexCollection *)local_2a0,&lp->col_lower_,
                             &lp->col_upper_,local_2a8,integrality);
        HighsLogOptions::HighsLogOptions(&local_150,log_options);
        std::__cxx11::string::string((string *)&local_2c8,"assessBounds",&local_2c9);
        HVar3 = interpretCallStatus(&local_150,HVar3,HVar4,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::_Function_base::~_Function_base(&local_150.user_callback.super__Function_base);
        bVar2 = HVar3 != kError;
      }
      HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)local_2a0);
      if (!bVar2) {
        return kError;
      }
    }
    iVar1 = lp->num_row_;
    if (iVar1 != 0) {
      local_2a0[0x10] = '\0';
      local_2a0._20_4_ = 0xffffffff;
      local_268 = (pointer)0x0;
      piStack_260 = (pointer)0x0;
      local_258 = (pointer)0x0;
      local_2a0._24_8_ = 0;
      uStack_280 = 0;
      uStack_27f = 0;
      uStack_278 = 0;
      uStack_277 = 0;
      local_2a0[4] = true;
      local_2a0._8_4_ = 0;
      local_2a0._12_4_ = iVar1 + -1;
      local_2a0._0_4_ = iVar1;
      HVar4 = assessBounds(options,"Row",0,(HighsIndexCollection *)local_2a0,&lp->row_lower_,
                           &lp->row_upper_,(options->super_HighsOptionsStruct).infinite_bound,
                           (HighsVarType *)0x0);
      HighsLogOptions::HighsLogOptions(&local_1b0,log_options);
      std::__cxx11::string::string((string *)&local_2c8,"assessBounds",&local_2c9);
      HVar3 = interpretCallStatus(&local_1b0,HVar4,HVar3,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::_Function_base::~_Function_base(&local_1b0.user_callback.super__Function_base);
      HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)local_2a0);
      if (HVar3 == kError) {
        return kError;
      }
    }
    HVar4 = kOk;
    if (lp->num_col_ != 0) {
      std::__cxx11::string::string((string *)&local_250,"LP",(allocator *)local_2a0);
      HVar4 = HighsSparseMatrix::assess
                        (&lp->a_matrix_,log_options,&local_250,
                         (options->super_HighsOptionsStruct).small_matrix_value,
                         (options->super_HighsOptionsStruct).large_matrix_value);
      std::__cxx11::string::~string((string *)&local_250);
      HighsLogOptions::HighsLogOptions(&local_210,log_options);
      std::__cxx11::string::string((string *)local_2a0,"assessMatrix",(allocator *)&local_2c8);
      HVar3 = interpretCallStatus(&local_210,HVar4,HVar3,(string *)local_2a0);
      std::__cxx11::string::~string((string *)local_2a0);
      std::_Function_base::~_Function_base(&local_210.user_callback.super__Function_base);
      HVar4 = kError;
      if (HVar3 != kError) {
        HVar5 = HighsSparseMatrix::numNz(&lp->a_matrix_);
        if (HVar5 < (int)((ulong)((long)(lp->a_matrix_).index_.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(lp->a_matrix_).index_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2)) {
          std::vector<int,_std::allocator<int>_>::resize(&(lp->a_matrix_).index_,(long)HVar5);
        }
        if (HVar5 < (int)((ulong)((long)(lp->a_matrix_).value_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(lp->a_matrix_).value_.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 3)) {
          std::vector<double,_std::allocator<double>_>::resize(&(lp->a_matrix_).value_,(long)HVar5);
        }
        HVar4 = kOk;
        if (HVar3 != kOk) {
          highsStatusToString_abi_cxx11_((string *)local_2a0,HVar3);
          highsLogDev(log_options,kInfo,"assessLp returns HighsStatus = %s\n",
                      CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
          std::__cxx11::string::~string((string *)local_2a0);
          HVar4 = HVar3;
        }
      }
    }
  }
  return HVar4;
}

Assistant:

HighsStatus assessLp(HighsLp& lp, const HighsOptions& options) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status = lpDimensionsOk("assessLp", lp, options.log_options)
                                ? HighsStatus::kOk
                                : HighsStatus::kError;
  return_status = interpretCallStatus(options.log_options, call_status,
                                      return_status, "assessLpDimensions");
  if (return_status == HighsStatus::kError) return return_status;

  if (lp.num_col_) {
    // Assess the LP column costs
    HighsIndexCollection index_collection;
    index_collection.dimension_ = lp.num_col_;
    index_collection.is_interval_ = true;
    index_collection.from_ = 0;
    index_collection.to_ = lp.num_col_ - 1;
    call_status = assessCosts(options, 0, index_collection, lp.col_cost_,
                              lp.has_infinite_cost_, options.infinite_cost);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessCosts");
    if (return_status == HighsStatus::kError) return return_status;
    // Assess the LP column bounds
    call_status = assessBounds(
        options, "Col", 0, index_collection, lp.col_lower_, lp.col_upper_,
        options.infinite_bound, lp.isMip() ? lp.integrality_.data() : nullptr);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessBounds");
    if (return_status == HighsStatus::kError) return return_status;
  }
  if (lp.num_row_) {
    // Assess the LP row bounds
    HighsIndexCollection index_collection;
    index_collection.dimension_ = lp.num_row_;
    index_collection.is_interval_ = true;
    index_collection.from_ = 0;
    index_collection.to_ = lp.num_row_ - 1;
    call_status =
        assessBounds(options, "Row", 0, index_collection, lp.row_lower_,
                     lp.row_upper_, options.infinite_bound);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessBounds");
    if (return_status == HighsStatus::kError) return return_status;
  }
  // If the LP has no columns the matrix must be empty and there is
  // nothing left to test
  if (lp.num_col_ == 0) {
    assert(!lp.a_matrix_.numNz());
    return HighsStatus::kOk;
  }
  // From here, any LP has lp.num_col_ > 0 and lp.a_matrix_.start_[lp.num_col_]
  // exists (as the number of nonzeros)
  assert(lp.num_col_ > 0);

  // Assess the LP matrix - even if there are no rows!
  call_status =
      lp.a_matrix_.assess(options.log_options, "LP", options.small_matrix_value,
                          options.large_matrix_value);
  return_status = interpretCallStatus(options.log_options, call_status,
                                      return_status, "assessMatrix");
  if (return_status == HighsStatus::kError) return return_status;
  // If entries have been removed from the matrix, resize the index
  // and value vectors to prevent bug in presolve
  HighsInt lp_num_nz = lp.a_matrix_.numNz();
  if ((HighsInt)lp.a_matrix_.index_.size() > lp_num_nz)
    lp.a_matrix_.index_.resize(lp_num_nz);
  if ((HighsInt)lp.a_matrix_.value_.size() > lp_num_nz)
    lp.a_matrix_.value_.resize(lp_num_nz);
  if (return_status != HighsStatus::kOk)
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "assessLp returns HighsStatus = %s\n",
                highsStatusToString(return_status).c_str());
  return return_status;
}